

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugLoc::parse(DWARFDebugLoc *this,DWARFDataExtractor *data)

{
  Twine ErrorBanner;
  undefined1 auVar1 [8];
  raw_ostream *OS;
  undefined1 local_c0 [8];
  Expected<llvm::DWARFDebugLoc::LocationList> LL;
  undefined8 uStack_48;
  undefined8 local_40;
  uint64_t local_38;
  uint64_t Offset;
  
  this->IsLittleEndian = (data->super_DataExtractor).IsLittleEndian != '\0';
  this->AddressSize = (uint)(data->super_DataExtractor).AddressSize;
  local_38 = 0;
  if ((data->super_DataExtractor).Data.Length != 0) {
    do {
      parseOneLocationList
                ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c0,this,data,&local_38);
      auVar1 = local_c0;
      if ((LL.field_0.TStorage.buffer[0x60] & 1U) != 0) {
        local_c0[0] = '\0';
        local_c0[1] = '\0';
        local_c0[2] = '\0';
        local_c0[3] = '\0';
        local_c0[4] = '\0';
        local_c0[5] = '\0';
        local_c0[6] = '\0';
        local_c0[7] = '\0';
        Offset = (ulong)auVar1 | 1;
        OS = WithColor::error();
        Twine::Twine((Twine *)&LL.field_0x68);
        ErrorBanner.RHS = (Child)uStack_48;
        ErrorBanner.LHS = (Child)LL._104_8_;
        ErrorBanner._16_8_ = local_40;
        logAllUnhandledErrors((Error *)&Offset,OS,ErrorBanner);
        if ((long *)(Offset & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(Offset & 0xfffffffffffffffe) + 8))();
        }
        Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
                  ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c0);
        return;
      }
      SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
                ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *)this,
                 (LocationList *)local_c0);
      Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
                ((Expected<llvm::DWARFDebugLoc::LocationList> *)local_c0);
    } while (local_38 < (data->super_DataExtractor).Data.Length);
  }
  return;
}

Assistant:

void DWARFDebugLoc::parse(const DWARFDataExtractor &data) {
  IsLittleEndian = data.isLittleEndian();
  AddressSize = data.getAddressSize();

  uint64_t Offset = 0;
  while (Offset < data.getData().size()) {
    if (auto LL = parseOneLocationList(data, &Offset))
      Locations.push_back(std::move(*LL));
    else {
      logAllUnhandledErrors(LL.takeError(), WithColor::error());
      break;
    }
  }
}